

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DebugNodeFont(ImFont *font)

{
  short sVar1;
  ImVec2 pos;
  ImFont *pIVar2;
  bool bVar3;
  ImU32 col;
  ImGuiIO *pIVar4;
  char *pcVar5;
  ImFontConfig *pIVar6;
  ImDrawList *this;
  ImGuiStyle *pIVar7;
  ImFontGlyph *pIVar8;
  ImU32 col_00;
  float fVar9;
  float size;
  ImVec2 IVar10;
  char *local_90;
  ImVec2 local_80 [2];
  ImFontGlyph *local_70;
  ImFontGlyph *glyph;
  ImVec2 cell_p2;
  ImVec2 cell_p1;
  uint n_1;
  ImVec2 base_pos;
  uint n;
  int count;
  uint base;
  float cell_spacing;
  float cell_size;
  ImU32 glyph_col;
  ImDrawList *draw_list;
  ImFontConfig *cfg;
  int config_i;
  int surface_sqrt;
  char c_str [5];
  ImFont *pIStack_10;
  bool opened;
  ImFont *font_local;
  
  if (font->ConfigData == (ImFontConfig *)0x0) {
    local_90 = "";
  }
  else {
    local_90 = font->ConfigData->Name;
  }
  pIStack_10 = font;
  surface_sqrt._3_1_ =
       TreeNode(font,"Font: \"%s\"\n%.2f px, %d glyphs, %d file(s)",(double)font->FontSize,local_90,
                (ulong)(uint)(font->Glyphs).Size,(ulong)(uint)(int)font->ConfigDataCount);
  SameLine(0.0,-1.0);
  bVar3 = SmallButton("Set as default");
  pIVar2 = pIStack_10;
  if (bVar3) {
    pIVar4 = GetIO();
    pIVar4->FontDefault = pIVar2;
  }
  if ((surface_sqrt._3_1_ & 1) != 0) {
    PushFont(pIStack_10);
    Text("The quick brown fox jumps over the lazy dog");
    PopFont();
    fVar9 = GetFontSize();
    SetNextItemWidth(fVar9 * 8.0);
    DragFloat("Font scale",&pIStack_10->Scale,0.005,0.3,2.0,"%.1f",0);
    SameLine(0.0,-1.0);
    MetricsHelpMarker(
                     "Note than the default embedded font is NOT meant to be scaled.\n\nFont are currently rendered into bitmaps at a given size at the time of building the atlas. You may oversample them to get some flexibility with scaling. You can also render at multiple sizes and select which one to use at runtime.\n\n(Glimmer of hope: the atlas system will be rewritten in the future to make scaling more flexible.)"
                     );
    Text("Ascent: %f, Descent: %f, Height: %f",(double)pIStack_10->Ascent,
         (double)pIStack_10->Descent,(double)(pIStack_10->Ascent - pIStack_10->Descent));
    pcVar5 = ImTextCharToUtf8((char *)((long)&config_i + 2),(uint)pIStack_10->FallbackChar);
    Text("Fallback character: \'%s\' (U+%04X)",pcVar5,(ulong)pIStack_10->FallbackChar);
    pcVar5 = ImTextCharToUtf8((char *)((long)&config_i + 2),(uint)pIStack_10->EllipsisChar);
    Text("Ellipsis character: \'%s\' (U+%04X)",pcVar5,(ulong)pIStack_10->EllipsisChar);
    fVar9 = sqrtf((float)pIStack_10->MetricsTotalSurface);
    Text("Texture Area: about %d px ~%dx%d px",(ulong)(uint)pIStack_10->MetricsTotalSurface,
         (ulong)(uint)(int)fVar9,(ulong)(uint)(int)fVar9);
    for (cfg._0_4_ = 0; (int)(uint)cfg < (int)pIStack_10->ConfigDataCount; cfg._0_4_ = (uint)cfg + 1
        ) {
      if ((pIStack_10->ConfigData != (ImFontConfig *)0x0) &&
         (pIVar6 = pIStack_10->ConfigData + (int)(uint)cfg, pIVar6 != (ImFontConfig *)0x0)) {
        BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d, Offset: (%.1f,%.1f)",
                   (double)(pIVar6->GlyphOffset).x,(double)(pIVar6->GlyphOffset).y,(ulong)(uint)cfg,
                   pIVar6->Name,(ulong)(uint)pIVar6->OversampleH,(ulong)(uint)pIVar6->OversampleV,
                   (ulong)(pIVar6->PixelSnapH & 1));
      }
    }
    bVar3 = TreeNode("Glyphs","Glyphs (%d)",(ulong)(uint)(pIStack_10->Glyphs).Size);
    if (bVar3) {
      this = GetWindowDrawList();
      col = GetColorU32(0,1.0);
      size = pIStack_10->FontSize * 1.0;
      pIVar7 = GetStyle();
      fVar9 = (pIVar7->ItemSpacing).y;
      for (n = 0; n < 0x10000; n = n + 0x100) {
        if (((n & 0xfff) == 0) &&
           (bVar3 = ImFont::IsGlyphRangeUnused(pIStack_10,n,n + 0xfff), bVar3)) {
          n = n + 0xf00;
        }
        else {
          base_pos.y = 0.0;
          for (base_pos.x = 0.0; sVar1 = (short)n, (uint)base_pos.x < 0x100;
              base_pos.x = (float)((int)base_pos.x + 1)) {
            pIVar8 = ImFont::FindGlyphNoFallback(pIStack_10,sVar1 + SUB42(base_pos.x,0));
            if (pIVar8 != (ImFontGlyph *)0x0) {
              base_pos.y = (float)((int)base_pos.y + 1);
            }
          }
          if (0 < (int)base_pos.y) {
            pcVar5 = "glyph";
            if (1 < (int)base_pos.y) {
              pcVar5 = "glyphs";
            }
            bVar3 = TreeNode((void *)(ulong)n,"U+%04X..U+%04X (%d %s)",(ulong)n,(ulong)(n + 0xff),
                             (ulong)(uint)base_pos.y,pcVar5);
            if (bVar3) {
              IVar10 = GetCursorScreenPos();
              for (cell_p1.x = 0.0; (uint)cell_p1.x < 0x100; cell_p1.x = (float)((int)cell_p1.x + 1)
                  ) {
                cell_p1.y = IVar10.x;
                n_1 = (uint)IVar10.y;
                ImVec2::ImVec2(&cell_p2,(float)((uint)cell_p1.x & 0xf) * (size + fVar9) + cell_p1.y,
                               (float)((uint)cell_p1.x >> 4) * (size + fVar9) + (float)n_1);
                ImVec2::ImVec2((ImVec2 *)((long)&glyph + 4),cell_p2.x + size,cell_p2.y + size);
                local_70 = ImFont::FindGlyphNoFallback(pIStack_10,sVar1 + SUB42(cell_p1.x,0));
                col_00 = 0x32ffffff;
                if (local_70 != (ImFontGlyph *)0x0) {
                  col_00 = 0x64ffffff;
                }
                ImDrawList::AddRect(this,&cell_p2,(ImVec2 *)((long)&glyph + 4),col_00,0.0,0,1.0);
                if (local_70 != (ImFontGlyph *)0x0) {
                  pos.y = cell_p2.y;
                  pos.x = cell_p2.x;
                  ImFont::RenderChar(pIStack_10,this,size,pos,col,sVar1 + SUB42(cell_p1.x,0));
                }
                if ((local_70 != (ImFontGlyph *)0x0) &&
                   (bVar3 = IsMouseHoveringRect(&cell_p2,(ImVec2 *)((long)&glyph + 4),true), bVar3))
                {
                  BeginTooltip();
                  Text("Codepoint: U+%04X",(ulong)(n + (int)cell_p1.x));
                  Separator();
                  Text("Visible: %d",(ulong)(*(uint *)local_70 >> 1 & 1));
                  Text("AdvanceX: %.1f",(double)local_70->AdvanceX);
                  Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)",(double)local_70->X0,(double)local_70->Y0,
                       (double)local_70->X1,(double)local_70->Y1);
                  Text("UV: (%.3f,%.3f)->(%.3f,%.3f)",(double)local_70->U0,(double)local_70->V0,
                       (double)local_70->U1,(double)local_70->V1);
                  EndTooltip();
                }
              }
              ImVec2::ImVec2(local_80,(size + fVar9) * 16.0,(size + fVar9) * 16.0);
              Dummy(local_80);
              TreePop();
            }
          }
        }
      }
      TreePop();
    }
    TreePop();
  }
  return;
}

Assistant:

void ImGui::DebugNodeFont(ImFont* font)
{
    bool opened = TreeNode(font, "Font: \"%s\"\n%.2f px, %d glyphs, %d file(s)",
        font->ConfigData ? font->ConfigData[0].Name : "", font->FontSize, font->Glyphs.Size, font->ConfigDataCount);
    SameLine();
    if (SmallButton("Set as default"))
        GetIO().FontDefault = font;
    if (!opened)
        return;

    // Display preview text
    PushFont(font);
    Text("The quick brown fox jumps over the lazy dog");
    PopFont();

    // Display details
    SetNextItemWidth(GetFontSize() * 8);
    DragFloat("Font scale", &font->Scale, 0.005f, 0.3f, 2.0f, "%.1f");
    SameLine(); MetricsHelpMarker(
        "Note than the default embedded font is NOT meant to be scaled.\n\n"
        "Font are currently rendered into bitmaps at a given size at the time of building the atlas. "
        "You may oversample them to get some flexibility with scaling. "
        "You can also render at multiple sizes and select which one to use at runtime.\n\n"
        "(Glimmer of hope: the atlas system will be rewritten in the future to make scaling more flexible.)");
    Text("Ascent: %f, Descent: %f, Height: %f", font->Ascent, font->Descent, font->Ascent - font->Descent);
    char c_str[5];
    Text("Fallback character: '%s' (U+%04X)", ImTextCharToUtf8(c_str, font->FallbackChar), font->FallbackChar);
    Text("Ellipsis character: '%s' (U+%04X)", ImTextCharToUtf8(c_str, font->EllipsisChar), font->EllipsisChar);
    const int surface_sqrt = (int)ImSqrt((float)font->MetricsTotalSurface);
    Text("Texture Area: about %d px ~%dx%d px", font->MetricsTotalSurface, surface_sqrt, surface_sqrt);
    for (int config_i = 0; config_i < font->ConfigDataCount; config_i++)
        if (font->ConfigData)
            if (const ImFontConfig* cfg = &font->ConfigData[config_i])
                BulletText("Input %d: \'%s\', Oversample: (%d,%d), PixelSnapH: %d, Offset: (%.1f,%.1f)",
                    config_i, cfg->Name, cfg->OversampleH, cfg->OversampleV, cfg->PixelSnapH, cfg->GlyphOffset.x, cfg->GlyphOffset.y);

    // Display all glyphs of the fonts in separate pages of 256 characters
    if (TreeNode("Glyphs", "Glyphs (%d)", font->Glyphs.Size))
    {
        ImDrawList* draw_list = GetWindowDrawList();
        const ImU32 glyph_col = GetColorU32(ImGuiCol_Text);
        const float cell_size = font->FontSize * 1;
        const float cell_spacing = GetStyle().ItemSpacing.y;
        for (unsigned int base = 0; base <= IM_UNICODE_CODEPOINT_MAX; base += 256)
        {
            // Skip ahead if a large bunch of glyphs are not present in the font (test in chunks of 4k)
            // This is only a small optimization to reduce the number of iterations when IM_UNICODE_MAX_CODEPOINT
            // is large // (if ImWchar==ImWchar32 we will do at least about 272 queries here)
            if (!(base & 4095) && font->IsGlyphRangeUnused(base, base + 4095))
            {
                base += 4096 - 256;
                continue;
            }

            int count = 0;
            for (unsigned int n = 0; n < 256; n++)
                if (font->FindGlyphNoFallback((ImWchar)(base + n)))
                    count++;
            if (count <= 0)
                continue;
            if (!TreeNode((void*)(intptr_t)base, "U+%04X..U+%04X (%d %s)", base, base + 255, count, count > 1 ? "glyphs" : "glyph"))
                continue;

            // Draw a 16x16 grid of glyphs
            ImVec2 base_pos = GetCursorScreenPos();
            for (unsigned int n = 0; n < 256; n++)
            {
                // We use ImFont::RenderChar as a shortcut because we don't have UTF-8 conversion functions
                // available here and thus cannot easily generate a zero-terminated UTF-8 encoded string.
                ImVec2 cell_p1(base_pos.x + (n % 16) * (cell_size + cell_spacing), base_pos.y + (n / 16) * (cell_size + cell_spacing));
                ImVec2 cell_p2(cell_p1.x + cell_size, cell_p1.y + cell_size);
                const ImFontGlyph* glyph = font->FindGlyphNoFallback((ImWchar)(base + n));
                draw_list->AddRect(cell_p1, cell_p2, glyph ? IM_COL32(255, 255, 255, 100) : IM_COL32(255, 255, 255, 50));
                if (glyph)
                    font->RenderChar(draw_list, cell_size, cell_p1, glyph_col, (ImWchar)(base + n));
                if (glyph && IsMouseHoveringRect(cell_p1, cell_p2))
                {
                    BeginTooltip();
                    Text("Codepoint: U+%04X", base + n);
                    Separator();
                    Text("Visible: %d", glyph->Visible);
                    Text("AdvanceX: %.1f", glyph->AdvanceX);
                    Text("Pos: (%.2f,%.2f)->(%.2f,%.2f)", glyph->X0, glyph->Y0, glyph->X1, glyph->Y1);
                    Text("UV: (%.3f,%.3f)->(%.3f,%.3f)", glyph->U0, glyph->V0, glyph->U1, glyph->V1);
                    EndTooltip();
                }
            }
            Dummy(ImVec2((cell_size + cell_spacing) * 16, (cell_size + cell_spacing) * 16));
            TreePop();
        }
        TreePop();
    }
    TreePop();
}